

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall asl::Console::color(Console *this,Color color)

{
  Color CVar1;
  bool bVar2;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *attr;
  bool bright;
  Color color_local;
  Console *this_local;
  
  bVar2 = (color & BRIGHT) == COLOR_DEFAULT;
  CVar1 = color & (BLACK|YELLOW);
  if (CVar1 == BLACK) {
    local_30 = "30";
  }
  else {
    if (CVar1 == RED) {
      local_38 = "31";
    }
    else {
      if (CVar1 == GREEN) {
        local_40 = "32";
      }
      else {
        if (CVar1 == YELLOW) {
          local_48 = "33";
        }
        else {
          if (CVar1 == BLUE) {
            local_50 = "34";
          }
          else {
            if (CVar1 == MAGENTA) {
              local_58 = "35";
            }
            else {
              if (CVar1 == CYAN) {
                local_60 = "36";
              }
              else {
                if (CVar1 == WHITE) {
                  local_68 = "37";
                }
                else {
                  if (bVar2) {
                    local_70 = "0";
                  }
                  else {
                    local_70 = "1";
                  }
                  local_68 = local_70;
                }
                local_60 = local_68;
              }
              local_58 = local_60;
            }
            local_50 = local_58;
          }
          local_48 = local_50;
        }
        local_40 = local_48;
      }
      local_38 = local_40;
    }
    local_30 = local_38;
  }
  if (bVar2) {
    printf("\x1b[22m");
  }
  else {
    printf("\x1b[1m");
  }
  printf("\x1b[%sm",local_30);
  this->_colorChanged = true;
  return;
}

Assistant:

void Console::color(Color color)
{
	bool bright = (color & BRIGHT);
	color = (Color)(color & 0x0f);
	const char* attr =
		color==BLACK? "30":
		color==RED? "31":
		color==GREEN? "32":
		color==YELLOW? "33":
		color==BLUE? "34":
		color==MAGENTA? "35":
		color==CYAN? "36":
		color==WHITE? "37":
		bright? "1":
		"0";
	if(bright)
		printf("\033[1m");
	else
		printf("\033[22m");
	printf("\033[%sm", attr);
	_colorChanged = true;
}